

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ostream *__os;
  unsigned_long ctr_2;
  undefined1 auVar3 [8];
  ulong uVar4;
  ulong uVar5;
  unsigned_long ctr;
  pointer pcVar6;
  reference rVar7;
  allocator_type local_219;
  ostream *local_218;
  undefined1 local_210 [8];
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  ostream *local_1e0;
  user_options opt;
  ostringstream str;
  undefined6 uStack_1a6;
  
  user_options::get(&opt,argc,argv);
  bVar1 = std::operator==(&opt.output,"-");
  if (bVar1) {
    auVar3 = (undefined1  [8])0x0;
    local_1e0 = (ostream *)&std::cout;
  }
  else {
    local_208._0_4_ = 0x34;
    std::make_unique<std::ofstream,std::__cxx11::string_const&,std::_Ios_Openmode>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
               (_Ios_Openmode *)&opt);
    auVar3 = local_210;
    cVar2 = std::__basic_file<char>::is_open();
    local_1e0 = (ostream *)auVar3;
    if (cVar2 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      __os = std::operator<<((ostream *)&str,"Could not open ");
      local_208._8_2_ = 0x22;
      local_208._0_8_ = &opt;
      std::__detail::operator<<
                (__os,(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                       *)local_208);
      std::__cxx11::stringbuf::str();
      pstore::raise<std::errc,std::__cxx11::string>
                (no_such_file_or_directory,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
    }
  }
  local_218 = (ostream *)auVar3;
  if (opt.maximum < 0x10000) {
    local_1f8._0_8_ = 0;
    local_208._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_208._8_8_ = 0;
    _str = 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,
               (unsigned_short *)&str);
    _str = CONCAT62(uStack_1a6,2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,
               (unsigned_short *)&str);
    local_210[0] = 1;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&str,opt.maximum + 1 >> 1,(bool *)local_210,
               &local_219);
    for (uVar4 = 3; uVar4 <= opt.maximum; uVar4 = uVar4 + 2) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&str,uVar4 >> 1);
      if ((*rVar7._M_p & rVar7._M_mask) != 0) {
        local_210._0_2_ = (short)uVar4;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,
                   (unsigned_short *)local_210);
        for (uVar5 = uVar4 * uVar4; uVar5 <= opt.maximum; uVar5 = uVar5 + uVar4 * 2) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&str,uVar5 >> 1);
          *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
        }
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&str);
    write_output<std::vector<unsigned_short,std::allocator<unsigned_short>>>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_208,opt.endianness,
               local_1e0);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)local_208);
  }
  else if (opt.maximum >> 0x20 == 0) {
    local_1f8._0_8_ = 0;
    local_208._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_208._8_8_ = 0;
    _str = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,(uint *)&str);
    _str = CONCAT44(uStack_1a6._2_4_,2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,(uint *)&str);
    local_210[0] = 1;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&str,opt.maximum + 1 >> 1,(bool *)local_210,
               &local_219);
    for (uVar4 = 3; uVar4 <= opt.maximum; uVar4 = uVar4 + 2) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&str,uVar4 >> 1);
      if ((*rVar7._M_p & rVar7._M_mask) != 0) {
        local_210._0_4_ = (int)uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,
                   (uint *)local_210);
        for (uVar5 = uVar4 * uVar4; uVar5 <= opt.maximum; uVar5 = uVar5 + uVar4 * 2) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&str,uVar5 >> 1);
          *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
        }
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&str);
    write_output<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,opt.endianness,
               local_1e0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  }
  else {
    local_1f8._0_8_ = 0;
    local_208._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_208._8_8_ = 0;
    _str = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,
               (unsigned_long *)&str);
    _str = 2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,
               (unsigned_long *)&str);
    local_210[0] = 1;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&str,opt.maximum + 1 >> 1,(bool *)local_210,
               &local_219);
    for (pcVar6 = (pointer)0x3; pcVar6 <= opt.maximum; pcVar6 = pcVar6 + 2) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&str,(ulong)pcVar6 >> 1);
      if ((*rVar7._M_p & rVar7._M_mask) != 0) {
        local_210 = (undefined1  [8])pcVar6;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,
                   (unsigned_long *)local_210);
        for (uVar4 = (long)pcVar6 * (long)pcVar6; uVar4 <= opt.maximum;
            uVar4 = uVar4 + (long)pcVar6 * 2) {
          rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)&str,uVar4 >> 1);
          *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
        }
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&str);
    write_output<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,opt.endianness,
               local_1e0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
  }
  if (local_218 != (ostream *)0x0) {
    (**(code **)(*(long *)local_218 + 8))();
  }
  std::__cxx11::string::~string((string *)&opt);
  return 0;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        user_options const opt = user_options::get (argc, argv);

        file_opener const out{opt.output};
        if (opt.maximum <= std::numeric_limits<std::uint16_t>::max ()) {
            write_output (sieve<std::uint16_t> (opt.maximum), opt.endianness, out.get_stream ());
        } else if (opt.maximum <= std::numeric_limits<std::uint32_t>::max ()) {
            write_output (sieve<std::uint32_t> (opt.maximum), opt.endianness, out.get_stream ());
        } else {
            write_output (sieve<std::uint64_t> (opt.maximum), opt.endianness, out.get_stream ());
        }
    }